

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>,std::shared_ptr<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (element_type *param_1,undefined8 param_2,undefined8 param_3,long *param_4,
          Type_Conversions_State *param_5)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> sVar2;
  _func_int **local_38;
  undefined8 uStack_30;
  _func_int **local_28;
  undefined8 uStack_20;
  
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&local_28,(Boxed_Value *)*param_4,param_5);
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&local_38,(Boxed_Value *)(*param_4 + 0x10),param_5);
  (param_1->first).m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0031d368;
  p_Var1[1]._vptr__Sp_counted_base = local_28;
  p_Var1[1]._M_use_count = (undefined4)uStack_20;
  p_Var1[1]._M_weak_count = uStack_20._4_4_;
  p_Var1[2]._vptr__Sp_counted_base = local_38;
  p_Var1[2]._M_use_count = (undefined4)uStack_30;
  p_Var1[2]._M_weak_count = uStack_30._4_4_;
  (param_1->first).m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (param_1->first).m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  sVar2.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = param_1;
  return (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>)
         sVar2.
         super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }